

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

uint64_t __thiscall
libtorrent::aux::anon_unknown_119::last_optimistic_unchoke_cmp::get_ext_priority
          (last_optimistic_unchoke_cmp *this,opt_unchoke_candidate *peer)

{
  _Atomic_word *p_Var1;
  pointer psVar2;
  element_type *peVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  pointer psVar6;
  ulong uVar7;
  element_type *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if (peer->ext_priority == 0xfffffffffffffffe) {
    peer->ext_priority = 0xffffffffffffffff;
    psVar6 = (this->plugins->
             super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    psVar2 = (this->plugins->
             super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (psVar6 != psVar2) {
      do {
        peVar3 = (psVar6->super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        ;
        local_40 = (peer->peer->
                   super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>)
                   ._M_ptr;
        local_38 = (peer->peer->
                   super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>)
                   ._M_refcount._M_pi;
        if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_38->_M_weak_count = local_38->_M_weak_count + 1;
            UNLOCK();
          }
          else {
            local_38->_M_weak_count = local_38->_M_weak_count + 1;
          }
        }
        iVar4 = (*peVar3->_vptr_plugin[10])(peVar3,&local_40);
        if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1 = &local_38->_M_weak_count;
            iVar5 = *p_Var1;
            *p_Var1 = *p_Var1 + -1;
            UNLOCK();
          }
          else {
            iVar5 = local_38->_M_weak_count;
            local_38->_M_weak_count = iVar5 + -1;
          }
          if (iVar5 == 1) {
            (*local_38->_vptr__Sp_counted_base[3])();
          }
        }
        uVar7 = CONCAT44(extraout_var,iVar4);
        if (peer->ext_priority < CONCAT44(extraout_var,iVar4)) {
          uVar7 = peer->ext_priority;
        }
        peer->ext_priority = uVar7;
        psVar6 = psVar6 + 1;
      } while (psVar6 != psVar2);
    }
  }
  return peer->ext_priority;
}

Assistant:

uint64_t get_ext_priority(opt_unchoke_candidate const& peer) const
			{
#ifndef TORRENT_DISABLE_EXTENSIONS
				if (peer.ext_priority == priority_undetermined)
				{
					peer.ext_priority = std::numeric_limits<uint64_t>::max();
					for (auto& e : plugins)
					{
						uint64_t const priority = e->get_unchoke_priority(peer_connection_handle(*peer.peer));
						peer.ext_priority = std::min(priority, peer.ext_priority);
					}
				}
				return peer.ext_priority;
#else
				TORRENT_UNUSED(peer);
				return std::numeric_limits<uint64_t>::max();
#endif
			}